

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall
QWidgetRepaintManager::QWidgetRepaintManager(QWidgetRepaintManager *this,QWidget *topLevel)

{
  QBackingStore *pQVar1;
  
  *(QWidget **)this = topLevel;
  pQVar1 = QWidget::backingStore(topLevel);
  *(QBackingStore **)(this + 8) = pQVar1;
  QRegion::QRegion((QRegion *)(this + 0x10));
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  QRegion::QRegion((QRegion *)(this + 0x48));
  *(undefined8 *)(this + 0x79) = 0;
  *(undefined8 *)(this + 0x81) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x90) = 0x8000000000000000;
  *(undefined8 *)(this + 0x98) = 0x8000000000000000;
  *(undefined4 *)(this + 0xa0) = 0;
  updateLists(this,topLevel);
  return;
}

Assistant:

QWidgetRepaintManager::QWidgetRepaintManager(QWidget *topLevel)
    : tlw(topLevel), store(tlw->backingStore())
{
    Q_ASSERT(store);

    // Ensure all existing subsurfaces and static widgets are added to their respective lists.
    updateLists(topLevel);
}